

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfutureinterface.cpp
# Opt level: O3

void __thiscall QFutureInterfaceBase::waitForFinished(QFutureInterfaceBase *this)

{
  __pointer_type pQVar1;
  uint uVar2;
  QFutureInterfaceBasePrivate *this_00;
  QThreadPool *pQVar3;
  QFutureInterfaceBasePrivate *__stat_loc;
  bool bVar4;
  
  this_00 = this->d;
  if (this_00 != (QFutureInterfaceBasePrivate *)0x0) {
    if ((((QBasicAtomicPointer<QMutexPrivate> *)&this_00->m_mutex)->_q_value)._M_b._M_p ==
        (__pointer_type)0x0) {
      LOCK();
      bVar4 = (((QBasicAtomicPointer<QMutexPrivate> *)&this_00->m_mutex)->_q_value)._M_b._M_p ==
              (__pointer_type)0x0;
      if (bVar4) {
        (((QBasicAtomicPointer<QMutexPrivate> *)&this_00->m_mutex)->_q_value)._M_b._M_p =
             (__pointer_type)0x1;
      }
      UNLOCK();
      if (bVar4) goto LAB_001eee49;
    }
    QBasicMutex::lockInternal((QBasicMutex *)this_00);
  }
LAB_001eee49:
  uVar2 = (this->d->state).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int>._M_i;
  LOCK();
  pQVar1 = (((QBasicAtomicPointer<QMutexPrivate> *)&this_00->m_mutex)->_q_value)._M_b._M_p;
  (((QBasicAtomicPointer<QMutexPrivate> *)&this_00->m_mutex)->_q_value)._M_b._M_p =
       (__pointer_type)0x0;
  UNLOCK();
  if (pQVar1 != (__pointer_type)0x1) {
    QBasicMutex::unlockInternalFutex((QBasicMutex *)this_00,pQVar1);
  }
  __stat_loc = this->d;
  if ((uVar2 & 4) != 0) {
    if (__stat_loc->hasException != true) {
      return;
    }
    goto LAB_001eef1c;
  }
  pQVar3 = __stat_loc->m_pool;
  if (pQVar3 == (QThreadPool *)0x0) {
    pQVar3 = QThreadPool::globalInstance();
    __stat_loc = this->d;
  }
  QThreadPoolPrivate::stealAndRunRunnable
            ((QThreadPoolPrivate *)(pQVar3->super_QObject).d_ptr.d,__stat_loc->runnable);
  if ((((QBasicAtomicPointer<QMutexPrivate> *)&this_00->m_mutex)->_q_value)._M_b._M_p ==
      (__pointer_type)0x0) {
    LOCK();
    bVar4 = (((QBasicAtomicPointer<QMutexPrivate> *)&this_00->m_mutex)->_q_value)._M_b._M_p ==
            (__pointer_type)0x0;
    if (bVar4) {
      (((QBasicAtomicPointer<QMutexPrivate> *)&this_00->m_mutex)->_q_value)._M_b._M_p =
           (__pointer_type)0x1;
    }
    UNLOCK();
    if (!bVar4) goto LAB_001eeea3;
  }
  else {
LAB_001eeea3:
    QBasicMutex::lockInternal((QBasicMutex *)this_00);
  }
  while (__stat_loc = this->d,
        ((__stat_loc->state).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i & 4U) == 0) {
    QWaitCondition::wait(&__stat_loc->waitCondition,__stat_loc);
  }
  if (__stat_loc->hasException == false) {
    if ((uVar2 & 4) == 0) {
      LOCK();
      pQVar1 = (((QBasicAtomicPointer<QMutexPrivate> *)&this_00->m_mutex)->_q_value)._M_b._M_p;
      (((QBasicAtomicPointer<QMutexPrivate> *)&this_00->m_mutex)->_q_value)._M_b._M_p =
           (__pointer_type)0x0;
      UNLOCK();
      if (pQVar1 != (__pointer_type)0x1) {
        QBasicMutex::unlockInternalFutex((QBasicMutex *)this_00,pQVar1);
        return;
      }
    }
    return;
  }
LAB_001eef1c:
  QtPrivate::ExceptionStore::rethrowException(&(__stat_loc->data).m_exceptionStore);
}

Assistant:

void QFutureInterfaceBase::waitForFinished()
{
    QMutexLocker lock(&d->m_mutex);
    const bool alreadyFinished = isFinished();
    lock.unlock();

    if (!alreadyFinished) {
        d->pool()->d_func()->stealAndRunRunnable(d->runnable);

        lock.relock();

        while (!isFinished())
            d->waitCondition.wait(&d->m_mutex);
    }

    if (d->hasException)
        d->data.m_exceptionStore.rethrowException();
}